

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    string *filename,LodePNGColorType colortype,uint bitdepth)

{
  undefined1 local_50 [4];
  uint error;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  string *filename_local;
  uint *h_local;
  uint *w_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = bitdepth;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = colortype;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  out_local._4_4_ =
       load_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,filename);
  if (out_local._4_4_ == 0) {
    out_local._4_4_ =
         decode(out,w,h,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
                (uint)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return out_local._4_4_;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const std::string& filename,
                LodePNGColorType colortype, unsigned bitdepth)
{
  std::vector<unsigned char> buffer;
  unsigned error = load_file(buffer, filename);
  if(error) return error;
  return decode(out, w, h, buffer, colortype, bitdepth);
}